

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall
OpenMD::NameFinder::matchTorsion
          (NameFinder *this,string *molName,string *torsionName,SelectionSet *bs)

{
  bool bVar1;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  *in_RDI;
  iterator k;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  torsionAtomNodes;
  iterator j;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  torsionNodes;
  iterator i;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  SelectionSet *in_stack_fffffffffffffee8;
  SelectionSet *in_stack_fffffffffffffef0;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_e0 [2];
  TreeNodePtr *in_stack_ffffffffffffff30;
  NameFinder *in_stack_ffffffffffffff38;
  TreeNodePtr *in_stack_ffffffffffffff40;
  NameFinder *in_stack_ffffffffffffff48;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_a0 [6];
  shared_ptr<OpenMD::TreeNode> *local_70;
  shared_ptr<OpenMD::TreeNode> *local_68;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_60 [12];
  
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr
            ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
             (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
  getMatchedChildren(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     (string *)in_stack_ffffffffffffff38);
  std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3f28b8);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  ::__normal_iterator(local_60);
  local_68 = (shared_ptr<OpenMD::TreeNode> *)
             std::
             vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                      *)in_stack_fffffffffffffee8);
  local_60[0]._M_current = local_68;
  while( true ) {
    local_70 = (shared_ptr<OpenMD::TreeNode> *)
               std::
               vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                      *)in_stack_fffffffffffffee8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator*(local_60);
    std::shared_ptr<OpenMD::TreeNode>::shared_ptr
              ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
               (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
    getMatchedChildren(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       (string *)in_stack_ffffffffffffff38);
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3f296d);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::__normal_iterator(local_a0);
    local_a0[0]._M_current =
         (shared_ptr<OpenMD::TreeNode> *)
         std::
         vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
         ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_fffffffffffffee8);
    while( true ) {
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             *)in_stack_fffffffffffffee8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator*(local_a0);
      in_stack_fffffffffffffef0 = (SelectionSet *)(local_e0 + 1);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffef0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
      getAllChildren(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3f29f9);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::__normal_iterator(local_e0);
      local_e0[0]._M_current =
           (shared_ptr<OpenMD::TreeNode> *)
           std::
           vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                    *)in_stack_fffffffffffffee8);
      while( true ) {
        std::
        vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
        ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
               *)in_stack_fffffffffffffee8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                            *)in_stack_fffffffffffffef0,
                           (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                            *)in_stack_fffffffffffffee8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
        ::operator*(local_e0);
        std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3f2a55);
        SelectionSet::operator|=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
        ::operator++(local_e0);
      }
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::~vector(in_RDI);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator++(local_a0);
    }
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    ~vector(in_RDI);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator++(local_60);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector(in_RDI);
  return;
}

Assistant:

void NameFinder::matchTorsion(const std::string& molName,
                                const std::string& torsionName,
                                SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> torsionNodes =
          getMatchedChildren(*i, torsionName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = torsionNodes.begin(); j != torsionNodes.end(); ++j) {
        std::vector<TreeNodePtr> torsionAtomNodes = getAllChildren(*j);
        std::vector<TreeNodePtr>::iterator k;
        for (k = torsionAtomNodes.begin(); k != torsionAtomNodes.end(); ++k) {
          bs |= (*k)->bs;
        }
      }
    }
  }